

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O3

void __thiscall helics::CoreApp::CoreApp(CoreApp *this,string_view argString)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 this_01;
  size_type sVar1;
  int iVar2;
  ParseOutput PVar3;
  void *pvVar4;
  undefined4 extraout_var;
  char *__s;
  _Alloc_hider _Var5;
  size_type __n;
  string_view name;
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  __s = argString._M_str;
  name._M_str = (char *)argString._M_len;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  if ((name._M_str == (char *)0x0) ||
     (pvVar4 = memchr(__s,0x2d,(size_t)name._M_str),
     (long)pvVar4 - (long)__s == -1 || pvVar4 == (void *)0x0)) {
    name._M_len = (size_t)(local_68 + 0x10);
    CoreFactory::findCore(name);
    sVar1 = local_58._M_string_length;
    _Var5._M_p = local_58._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var5._M_p;
    this_00 = (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      _Var5._M_p = (pointer)(this->core).
                            super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if ((element_type *)_Var5._M_p != (element_type *)0x0) {
      iVar2 = (*((element_type *)_Var5._M_p)->_vptr_Core[0xc])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar2));
      return;
    }
  }
  local_68._8_8_ = &this->name;
  generateParser((CoreApp *)local_68);
  this_01 = local_68._0_8_;
  local_58._M_dataplus._M_p = local_68 + 0x20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_68 + 0x10),__s,name._M_str + (long)__s);
  PVar3 = helicsCLI11App::helics_parse<std::__cxx11::string>
                    ((helicsCLI11App *)this_01,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_68 + 0x10));
  if (local_58._M_dataplus._M_p != local_68 + 0x20) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (PVar3 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)local_68);
  }
  if ((_Head_base<0UL,_helics::helicsCLI11App_*,_false>)local_68._0_8_ !=
      (_Head_base<0UL,_helics::helicsCLI11App_*,_false>)0x0) {
    (*((App *)local_68._0_8_)->_vptr_App[1])();
  }
  return;
}

Assistant:

CoreApp::CoreApp(std::string_view argString)
{
    if (argString.find_first_of('-') == std::string::npos) {
        core = CoreFactory::findCore(argString);
        if (core) {
            name = core->getIdentifier();
            return;
        }
    }
    auto app = generateParser();
    if (app->helics_parse(std::string{argString}) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}